

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase511::run(TestCase511 *this)

{
  Detail *pDVar1;
  Fault node;
  undefined8 uVar2;
  PromiseBase node_00;
  long *plVar3;
  void *pvVar4;
  TransformPromiseNodeBase *pTVar5;
  Exception *this_00;
  OwnPromiseNode this_01;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:531:40),_int>
  branch1;
  DebugExpression<bool> _kjCondition_4;
  Fault f;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:536:40),_int>
  branch2;
  ForkedPromise<int> fork;
  Promise<int> promise;
  WaitScope waitScope;
  EventLoop loop;
  Fault local_190;
  int local_184;
  undefined1 local_180 [32];
  PromiseBase local_160;
  PromiseBase local_158;
  long *local_150;
  TransformPromiseNodeBase *local_148;
  __pid_t local_13c;
  EventLoop *local_138;
  uint local_130;
  OwnPromiseNode local_128;
  ExceptionOrValue *pEStack_120;
  char *local_118;
  ForkBranchBase **ppFStack_110;
  undefined1 local_108 [32];
  char *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  char *local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  EventLoop local_a0;
  
  EventLoop::EventLoop(&local_a0);
  local_130 = 0xffffffff;
  local_128.ptr = (PromiseNode *)0x0;
  pEStack_120 = (ExceptionOrValue *)0x0;
  local_138 = &local_a0;
  EventLoop::enterScope(&local_a0);
  yield();
  uVar2 = local_180._0_8_;
  pDVar1 = (Detail *)(((String *)local_180._0_8_)->content).size_;
  if (pDVar1 == (Detail *)0x0 || (ulong)(local_180._0_8_ - (long)pDVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    pTVar5 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar5,(OwnPromiseNode *)local_180,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:515:36)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_006268b0;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    (((String *)local_180._0_8_)->content).size_ = 0;
    pTVar5 = (TransformPromiseNodeBase *)&((Exception *)(local_180._0_8_ + -400))->traceCount;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar5,(OwnPromiseNode *)local_180,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:515:36)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)&((Exception *)(uVar2 + -400))->traceCount = &PTR_destroy_006268b0;
    (((Exception *)(uVar2 + -400))->details).builder.ptr = pDVar1;
  }
  uVar2 = local_180._0_8_;
  local_148 = pTVar5;
  if ((Exception *)local_180._0_8_ != (Exception *)0x0) {
    local_180._0_8_ = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  uStack_b0 = "run";
  local_a8 = 0xf00000205;
  Promise<int>::fork((Promise<int> *)&local_158);
  local_190.exception._0_1_ = *(uint *)(local_150 + 10) < 2;
  if (*(uint *)(local_150 + 10) >= 2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x20c,FAILED,"!fork.hasBranches()","_kjCondition,",
               (DebugExpression<bool> *)&local_190);
    kj::_::Debug::Fault::fatal((Fault *)local_180);
  }
  kj::_::ForkHub<int>::addBranch((ForkHub<int> *)local_180);
  uVar2 = local_180._0_8_;
  local_160.node.ptr._0_1_ = *(uint *)(local_150 + 10) >= 2;
  if (*(uint *)(local_150 + 10) < 2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x20f,FAILED,"fork.hasBranches()","_kjCondition,",
               (DebugExpression<bool> *)&local_160);
    kj::_::Debug::Fault::fatal(&local_190);
  }
  if ((Exception *)local_180._0_8_ != (Exception *)0x0) {
    local_180._0_8_ = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  local_190.exception._0_1_ = *(uint *)(local_150 + 10) < 2;
  if (*(uint *)(local_150 + 10) >= 2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x211,FAILED,"!fork.hasBranches()","_kjCondition,",
               (DebugExpression<bool> *)&local_190);
    kj::_::Debug::Fault::fatal((Fault *)local_180);
  }
  kj::_::ForkHub<int>::addBranch((ForkHub<int> *)local_180);
  uVar2 = local_180._0_8_;
  pDVar1 = (Detail *)(((String *)local_180._0_8_)->content).size_;
  if (pDVar1 == (Detail *)0x0 || (ulong)(local_180._0_8_ - (long)pDVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    this_00 = (Exception *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)local_180,
               kj::_::
               SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:531:40)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00626908;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    (((String *)local_180._0_8_)->content).size_ = 0;
    this_00 = (Exception *)&((Exception *)(local_180._0_8_ + -400))->traceCount;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)local_180,
               kj::_::
               SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:531:40)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)&((Exception *)(uVar2 + -400))->traceCount = &PTR_destroy_00626908;
    (((Exception *)(uVar2 + -400))->details).builder.ptr = pDVar1;
  }
  uVar2 = local_180._0_8_;
  local_190.exception = this_00;
  if ((Exception *)local_180._0_8_ != (Exception *)0x0) {
    local_180._0_8_ = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  local_160.node.ptr._0_1_ = *(uint *)(local_150 + 10) >= 2;
  if (*(uint *)(local_150 + 10) < 2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x217,FAILED,"fork.hasBranches()","_kjCondition,",
               (DebugExpression<bool> *)&local_160);
    kj::_::Debug::Fault::fatal((Fault *)local_180);
  }
  kj::_::ForkHub<int>::addBranch((ForkHub<int> *)local_180);
  uVar2 = local_180._0_8_;
  pDVar1 = (Detail *)(((String *)local_180._0_8_)->content).size_;
  if (pDVar1 == (Detail *)0x0 || (ulong)(local_180._0_8_ - (long)pDVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    this_01.ptr = (PromiseNode *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_01.ptr,(OwnPromiseNode *)local_180,
               kj::_::
               SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:536:40)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00626960;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    (((String *)local_180._0_8_)->content).size_ = 0;
    this_01.ptr = (PromiseNode *)&((Exception *)(local_180._0_8_ + -400))->traceCount;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_01.ptr,(OwnPromiseNode *)local_180,
               kj::_::
               SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:536:40)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)&((Exception *)(uVar2 + -400))->traceCount = &PTR_destroy_00626960;
    (((Exception *)(uVar2 + -400))->details).builder.ptr = pDVar1;
  }
  uVar2 = local_180._0_8_;
  local_160.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this_01.ptr;
  if ((Exception *)local_180._0_8_ != (Exception *)0x0) {
    local_180._0_8_ = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  plVar3 = local_150;
  local_184 = CONCAT31(local_184._1_3_,1 < *(uint *)(local_150 + 10));
  if (1 < *(uint *)(local_150 + 10)) {
    local_150 = (long *)0x0;
    if (plVar3 != (long *)0x0) {
      (*(code *)**(undefined8 **)local_158.node.ptr)
                (local_158.node.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    uStack_c8 = "run";
    local_c0 = (Disposer *)0x2900000222;
    local_180._4_4_ = Promise<int>::wait((Promise<int> *)&local_190,&local_138);
    local_180._0_4_ = 0x1c8;
    local_180._8_8_ = " == ";
    local_180._16_8_ = &DAT_00000005;
    local_180[0x18] = local_180._4_4_ == 0x1c8;
    if ((!local_180[0x18]) && (kj::_::Debug::minSeverity < 3)) {
      local_184 = 0x1c8;
      local_e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
      ;
      uStack_e0 = (long)"this branch shouldn\'t run" + 0x16;
      local_d8 = (char *)0x2900000222;
      local_13c = Promise<int>::wait((Promise<int> *)&local_190,&local_138);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x222,ERROR,
                 "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", _kjCondition, 456, branch1.wait(waitScope)"
                 ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",
                 (DebugComparison<int,_int> *)local_180,&local_184,&local_13c);
    }
    local_108._8_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    local_108._16_8_ = (long)"this branch shouldn\'t run" + 0x16;
    local_108._24_8_ = (ArrayDisposer *)0x2900000223;
    local_180._4_4_ = Promise<int>::wait((Promise<int> *)&local_160,&local_138);
    local_180._0_4_ = 0x315;
    local_180._8_8_ = " == ";
    local_180._16_8_ = &DAT_00000005;
    local_180[0x18] = local_180._4_4_ == 0x315;
    if ((!local_180[0x18]) && (kj::_::Debug::minSeverity < 3)) {
      local_184 = 0x315;
      local_118 = 
      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
      ;
      ppFStack_110 = (ForkBranchBase **)0x4ac413;
      local_108._0_8_ = 0x2900000223;
      local_13c = Promise<int>::wait((Promise<int> *)&local_160,&local_138);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x223,ERROR,
                 "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", _kjCondition, 789, branch2.wait(waitScope)"
                 ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",
                 (DebugComparison<int,_int> *)local_180,&local_184,&local_13c);
    }
    node_00.node.ptr = local_160.node.ptr;
    if (local_160.node.ptr != (PromiseNode *)0x0) {
      local_160.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00.node.ptr);
    }
    node.exception = local_190.exception;
    if (local_190.exception != (Exception *)0x0) {
      local_190.exception = (Exception *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
    }
    plVar3 = local_150;
    if (local_150 != (long *)0x0) {
      local_150 = (long *)0x0;
      (*(code *)**(undefined8 **)local_158.node.ptr)
                (local_158.node.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    pTVar5 = local_148;
    if (local_148 != (TransformPromiseNodeBase *)0x0) {
      local_148 = (TransformPromiseNodeBase *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pTVar5);
    }
    if (local_128.ptr == (PromiseNode *)0x0) {
      EventLoop::leaveScope(local_138);
    }
    EventLoop::~EventLoop(&local_a0);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,0x21c,FAILED,"fork.hasBranches()","_kjCondition,",(DebugExpression<bool> *)&local_184)
  ;
  kj::_::Debug::Fault::fatal((Fault *)local_180);
}

Assistant:

TEST(Async, Fork) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() { return 123; });

  auto fork = promise.fork();

#if __GNUC__ && !__clang__ && __GNUC__ >= 7
// GCC 7 decides the open-brace below is "misleadingly indented" as if it were guarded by the `for`
// that appears in the implementation of KJ_REQUIRE(). Shut up shut up shut up.
#pragma GCC diagnostic ignored "-Wmisleading-indentation"
#endif
  KJ_ASSERT(!fork.hasBranches());
  {
    auto cancelBranch = fork.addBranch();
    KJ_ASSERT(fork.hasBranches());
  }
  KJ_ASSERT(!fork.hasBranches());

  auto branch1 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 456;
  });
  KJ_ASSERT(fork.hasBranches());
  auto branch2 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 789;
  });
  KJ_ASSERT(fork.hasBranches());

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}